

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void __thiscall JsonArray_Empty_Test::TestBody(JsonArray_Empty_Test *this)

{
  StrictMock<mock_json_callbacks> *__return_storage_ptr__;
  TypedExpectation<std::error_code_()> *pTVar1;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  mock_json_callbacks *this_00;
  char *message;
  char *in_R9;
  coord local_f0;
  AssertHelper local_e8;
  InSequence _;
  undefined7 uStack_df;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8 [3];
  AssertionResult gtest_ar_;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  
  testing::InSequence::InSequence(&_);
  __return_storage_ptr__ = &(this->super_JsonArray).callbacks_;
  p.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )mock_json_callbacks::gmock_begin_array
                   ((MockSpec<std::error_code_()> *)__return_storage_ptr__,in_RSI);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)&p,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x2a,"callbacks_","begin_array ()");
  this_00 = (mock_json_callbacks *)0x1;
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar1,1);
  p.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )mock_json_callbacks::gmock_end_array
                   ((MockSpec<std::error_code_()> *)__return_storage_ptr__,this_00);
  testing::internal::GetWithoutMatchers();
  extensions = 0x16d83b;
  pTVar1 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)&p,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x2b,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar1,1);
  testing::InSequence::~InSequence(&_);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            (&p,(json *)&(this->super_JsonArray).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x0,
             extensions);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_,"[\n]\n",4);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input(&p,(string *)&_);
  std::__cxx11::string::~string((string *)&_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(&p);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = p.error_._M_value == 0;
  if (p.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_f0);
    std::operator<<((ostream *)((long)local_f0 + 0x10),"Expected the parse to succeed");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&_,(internal *)&gtest_ar_,(AssertionResult *)"p.last_error ()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x30,(char *)CONCAT71(uStack_df,_.sequence_created_));
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&_);
    if (local_f0 != (coord)0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = p.coordinate_;
  local_f0.column = 1;
  local_f0.row = 3;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)&_,"p.coordinate ()","(json::coord{1U, 3U})",(coord *)&gtest_ar_,&local_f0)
  ;
  if (_.sequence_created_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_d8[0]._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)local_d8[0]._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(local_d8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonArray, Empty) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    p.eof ();
    EXPECT_FALSE (p.last_error ()) << "Expected the parse to succeed";
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 3U}));
}